

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O0

void __thiscall
mp::internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
AppSolutionHandlerImpl
          (AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          StringRef stub,TestSolver *s,StrictMockProblemBuilder *b,ArrayRef<long> *options,
          uint banner_size)

{
  undefined8 *in_RDI;
  undefined4 in_stack_00000008;
  ArrayRef<long> *other;
  StrictMockProblemBuilder *in_stack_ffffffffffffff80;
  TestSolver *in_stack_ffffffffffffff88;
  SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
  *in_stack_ffffffffffffff90;
  StringRef in_stack_ffffffffffffff98;
  
  other = (ArrayRef<long> *)&stack0xffffffffffffff90;
  ArrayRef<long>::ArrayRef((ArrayRef<long> *)in_stack_ffffffffffffff80,other);
  SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::SolutionWriterImpl
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,other);
  ArrayRef<long>::~ArrayRef((ArrayRef<long> *)0x229759);
  *in_RDI = &PTR__AppSolutionHandlerImpl_003a2d50;
  *(undefined4 *)((long)in_RDI + 0x84) = in_stack_00000008;
  return;
}

Assistant:

AppSolutionHandlerImpl(fmt::StringRef stub, Solver &s,
                    ProblemBuilder &b,
                    ArrayRef<long> options, unsigned banner_size)
  : SolutionWriterImpl<Solver, ProblemBuilder, Writer>
      (stub, s, b, options),  banner_size_(banner_size) {}